

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_tester.cc
# Opt level: O1

void __thiscall
google::protobuf::MapReflectionTester::ExpectClearViaReflectionIterator
          (MapReflectionTester *this,Message *message)

{
  FieldDescriptor *pFVar1;
  Reflection *this_00;
  char *in_R9;
  pointer *__ptr;
  pointer *__ptr_16;
  Metadata MVar2;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  string_view name_25;
  string_view name_26;
  string_view name_27;
  string_view name_28;
  string_view name_29;
  string_view name_30;
  string_view name_31;
  string_view name_32;
  AssertionResult gtest_ar_;
  AssertHelper local_d0;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [3];
  MapIterator local_70;
  
  MVar2 = Message::GetMetadata(message);
  this_00 = MVar2.reflection;
  name._M_str = "map_int32_int32";
  name._M_len = 0xf;
  pFVar1 = F(this,name);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_00._M_str = "map_int32_int32";
  name_00._M_len = 0xf;
  pFVar1 = F(this,name_00);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_int32\")) == reflection->MapEnd(message, F(\"map_int32_int32\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x662,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_01._M_str = "map_int64_int64";
  name_01._M_len = 0xf;
  pFVar1 = F(this,name_01);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_02._M_str = "map_int64_int64";
  name_02._M_len = 0xf;
  pFVar1 = F(this,name_02);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int64_int64\")) == reflection->MapEnd(message, F(\"map_int64_int64\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x664,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_03._M_str = "map_uint32_uint32";
  name_03._M_len = 0x11;
  pFVar1 = F(this,name_03);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_04._M_str = "map_uint32_uint32";
  name_04._M_len = 0x11;
  pFVar1 = F(this,name_04);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_uint32_uint32\")) == reflection->MapEnd(message, F(\"map_uint32_uint32\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x666,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_05._M_str = "map_uint64_uint64";
  name_05._M_len = 0x11;
  pFVar1 = F(this,name_05);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_06._M_str = "map_uint64_uint64";
  name_06._M_len = 0x11;
  pFVar1 = F(this,name_06);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_uint64_uint64\")) == reflection->MapEnd(message, F(\"map_uint64_uint64\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x668,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_07._M_str = "map_sint32_sint32";
  name_07._M_len = 0x11;
  pFVar1 = F(this,name_07);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_08._M_str = "map_sint32_sint32";
  name_08._M_len = 0x11;
  pFVar1 = F(this,name_08);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_sint32_sint32\")) == reflection->MapEnd(message, F(\"map_sint32_sint32\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x66a,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_09._M_str = "map_sint64_sint64";
  name_09._M_len = 0x11;
  pFVar1 = F(this,name_09);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_10._M_str = "map_sint64_sint64";
  name_10._M_len = 0x11;
  pFVar1 = F(this,name_10);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_sint64_sint64\")) == reflection->MapEnd(message, F(\"map_sint64_sint64\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x66c,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_11._M_str = "map_fixed32_fixed32";
  name_11._M_len = 0x13;
  pFVar1 = F(this,name_11);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_12._M_str = "map_fixed32_fixed32";
  name_12._M_len = 0x13;
  pFVar1 = F(this,name_12);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_fixed32_fixed32\")) == reflection->MapEnd(message, F(\"map_fixed32_fixed32\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x66e,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_13._M_str = "map_fixed64_fixed64";
  name_13._M_len = 0x13;
  pFVar1 = F(this,name_13);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_14._M_str = "map_fixed64_fixed64";
  name_14._M_len = 0x13;
  pFVar1 = F(this,name_14);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_fixed64_fixed64\")) == reflection->MapEnd(message, F(\"map_fixed64_fixed64\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x670,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_15._M_str = "map_sfixed32_sfixed32";
  name_15._M_len = 0x15;
  pFVar1 = F(this,name_15);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_16._M_str = "map_sfixed32_sfixed32";
  name_16._M_len = 0x15;
  pFVar1 = F(this,name_16);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_sfixed32_sfixed32\")) == reflection->MapEnd(message, F(\"map_sfixed32_sfixed32\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x672,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_17._M_str = "map_sfixed64_sfixed64";
  name_17._M_len = 0x15;
  pFVar1 = F(this,name_17);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_18._M_str = "map_sfixed64_sfixed64";
  name_18._M_len = 0x15;
  pFVar1 = F(this,name_18);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_sfixed64_sfixed64\")) == reflection->MapEnd(message, F(\"map_sfixed64_sfixed64\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x674,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_19._M_str = "map_int32_float";
  name_19._M_len = 0xf;
  pFVar1 = F(this,name_19);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_20._M_str = "map_int32_float";
  name_20._M_len = 0xf;
  pFVar1 = F(this,name_20);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_float\")) == reflection->MapEnd(message, F(\"map_int32_float\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x676,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_21._M_str = "map_int32_double";
  name_21._M_len = 0x10;
  pFVar1 = F(this,name_21);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_22._M_str = "map_int32_double";
  name_22._M_len = 0x10;
  pFVar1 = F(this,name_22);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_double\")) == reflection->MapEnd(message, F(\"map_int32_double\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x678,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_23._M_str = "map_bool_bool";
  name_23._M_len = 0xd;
  pFVar1 = F(this,name_23);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_24._M_str = "map_bool_bool";
  name_24._M_len = 0xd;
  pFVar1 = F(this,name_24);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_bool_bool\")) == reflection->MapEnd(message, F(\"map_bool_bool\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x67a,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_25._M_str = "map_string_string";
  name_25._M_len = 0x11;
  pFVar1 = F(this,name_25);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_26._M_str = "map_string_string";
  name_26._M_len = 0x11;
  pFVar1 = F(this,name_26);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_string_string\")) == reflection->MapEnd(message, F(\"map_string_string\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x67c,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_27._M_str = "map_int32_bytes";
  name_27._M_len = 0xf;
  pFVar1 = F(this,name_27);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_28._M_str = "map_int32_bytes";
  name_28._M_len = 0xf;
  pFVar1 = F(this,name_28);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_bytes\")) == reflection->MapEnd(message, F(\"map_int32_bytes\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x67e,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_29._M_str = "map_int32_enum";
  name_29._M_len = 0xe;
  pFVar1 = F(this,name_29);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_30._M_str = "map_int32_enum";
  name_30._M_len = 0xe;
  pFVar1 = F(this,name_30);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_enum\")) == reflection->MapEnd(message, F(\"map_int32_enum\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x680,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  name_31._M_str = "map_int32_foreign_message";
  name_31._M_len = 0x19;
  pFVar1 = F(this,name_31);
  Reflection::MapBegin((MapIterator *)local_b8,this_00,message,pFVar1);
  name_32._M_str = "map_int32_foreign_message";
  name_32._M_len = 0x19;
  pFVar1 = F(this,name_32);
  Reflection::MapEnd(&local_70,this_00,message,pFVar1);
  local_c8[0] = (internal)
                internal::MapFieldBase::EqualIterator
                          ((MapFieldBase *)local_a8[0]._8_8_,(MapIterator *)local_b8,&local_70);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_c8[0]) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_b8,local_c8,
               (AssertionResult *)
               "reflection->MapBegin(message, F(\"map_int32_foreign_message\")) == reflection->MapEnd(message, F(\"map_int32_foreign_message\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_tester.cc"
               ,0x682,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((NodeBase *)local_b8._0_8_ != (NodeBase *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_a8[0]._M_allocated_capacity + 1);
    }
    if (local_70.iter_.node_ != (NodeBase *)0x0) {
      (*(code *)(local_70.iter_.node_)->next[1].next)();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  return;
}

Assistant:

void MapReflectionTester::ExpectClearViaReflectionIterator(Message* message) {
  const Reflection* reflection = message->GetReflection();
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_int32")) ==
              reflection->MapEnd(message, F("map_int32_int32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int64_int64")) ==
              reflection->MapEnd(message, F("map_int64_int64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_uint32_uint32")) ==
              reflection->MapEnd(message, F("map_uint32_uint32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_uint64_uint64")) ==
              reflection->MapEnd(message, F("map_uint64_uint64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_sint32_sint32")) ==
              reflection->MapEnd(message, F("map_sint32_sint32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_sint64_sint64")) ==
              reflection->MapEnd(message, F("map_sint64_sint64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_fixed32_fixed32")) ==
              reflection->MapEnd(message, F("map_fixed32_fixed32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_fixed64_fixed64")) ==
              reflection->MapEnd(message, F("map_fixed64_fixed64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_sfixed32_sfixed32")) ==
              reflection->MapEnd(message, F("map_sfixed32_sfixed32")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_sfixed64_sfixed64")) ==
              reflection->MapEnd(message, F("map_sfixed64_sfixed64")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_float")) ==
              reflection->MapEnd(message, F("map_int32_float")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_double")) ==
              reflection->MapEnd(message, F("map_int32_double")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_bool_bool")) ==
              reflection->MapEnd(message, F("map_bool_bool")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_string_string")) ==
              reflection->MapEnd(message, F("map_string_string")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_bytes")) ==
              reflection->MapEnd(message, F("map_int32_bytes")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_enum")) ==
              reflection->MapEnd(message, F("map_int32_enum")));
  EXPECT_TRUE(reflection->MapBegin(message, F("map_int32_foreign_message")) ==
              reflection->MapEnd(message, F("map_int32_foreign_message")));
}